

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O2

void loadData(void)

{
  istream *piVar1;
  string line;
  ifstream ignoredUsersFile;
  
  std::ifstream::ifstream((istream *)&ignoredUsersFile,"data/ignored_users.txt",_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ignoredUsersFile,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&ignoredUsers_abi_cxx11_,&line);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&ignoredUsersFile);
  return;
}

Assistant:

void loadData() {
    std::ifstream ignoredUsersFile("data/ignored_users.txt");
    std::string line;
    while (std::getline(ignoredUsersFile, line)) {
        ignoredUsers.insert(line);
    }
}